

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O0

void __thiscall
btBox2dShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btBox2dShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btScalar bVar1;
  btScalar bVar2;
  btVector3 *this_00;
  btScalar *pbVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  btBox2dShape *in_RDI;
  btVector3 *vec;
  int i;
  btVector3 *halfExtents;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btVector3 *local_38;
  int local_2c;
  btVector3 *local_28;
  int local_1c;
  long local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = getHalfExtentsWithoutMargin(in_RDI);
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    local_38 = (btVector3 *)(local_10 + (long)local_2c * 0x10);
    this_00 = (btVector3 *)(local_18 + (long)local_2c * 0x10);
    pbVar3 = btVector3::x(local_38);
    bVar1 = *pbVar3;
    pbVar3 = btVector3::x(local_28);
    bVar2 = *pbVar3;
    pbVar3 = btVector3::x(local_28);
    local_3c = btFsel(bVar1,bVar2,-*pbVar3);
    pbVar3 = btVector3::y(local_38);
    bVar1 = *pbVar3;
    pbVar3 = btVector3::y(local_28);
    bVar2 = *pbVar3;
    pbVar3 = btVector3::y(local_28);
    local_40 = btFsel(bVar1,bVar2,-*pbVar3);
    pbVar3 = btVector3::z(local_38);
    bVar1 = *pbVar3;
    pbVar3 = btVector3::z(local_28);
    bVar2 = *pbVar3;
    pbVar3 = btVector3::z(local_28);
    local_44 = btFsel(bVar1,bVar2,-*pbVar3);
    btVector3::setValue(this_00,&local_3c,&local_40,&local_44);
  }
  return;
}

Assistant:

virtual void	batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
	{
		const btVector3& halfExtents = getHalfExtentsWithoutMargin();
	
		for (int i=0;i<numVectors;i++)
		{
			const btVector3& vec = vectors[i];
			supportVerticesOut[i].setValue(btFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
				btFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
				btFsels(vec.z(), halfExtents.z(), -halfExtents.z())); 
		}

	}